

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph.h
# Opt level: O2

uint32_t pgraph_offset_mask(chipset_info *chipset)

{
  int iVar1;
  uint32_t uVar2;
  
  iVar1 = chipset->chipset;
  if (iVar1 < 4) {
    return (uint)(chipset->gpu == GPU_NV3T) << 0x16 | 0x3ffff0;
  }
  uVar2 = 0xfffff0;
  if (iVar1 != 4) {
    uVar2 = 0x1fffff0;
    if (((0xf < chipset->card_type) && (uVar2 = 0x7fffff0, 0x1f < (uint)chipset->card_type)) &&
       (uVar2 = 0x3fffffc0, iVar1 == 0x34)) {
      uVar2 = 0x3ffffff0;
    }
  }
  return uVar2;
}

Assistant:

static inline uint32_t pgraph_offset_mask(const struct chipset_info *chipset) {
	if (chipset->chipset < 4)
		return chipset->gpu == GPU_NV3T ? 0x007ffff0 : 0x003ffff0;
	if (chipset->chipset < 5)
		return 0x00fffff0;
	else if (chipset->card_type < 0x10)
		return 0x01fffff0;
	else if (chipset->card_type < 0x20)
		return 0x07fffff0;
	else if (chipset->chipset == 0x34)
		return 0x3ffffff0;
	else
		return 0x3fffffc0;
}